

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::Read3dmReferencedComponentIndex
          (ON_BinaryArchive *this,Type component_type,int *component_index)

{
  ON_2dex *pOVar1;
  ON_DimStyle *pOVar2;
  ON__INT32 OVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ON_ComponentManifestItem *this_00;
  ON_ManifestMapItem *this_01;
  ON_Material *pOVar8;
  int archive_text_style_index;
  long lVar9;
  int archive_component_index;
  ON__INT32 local_4c;
  ON_UUID_struct *local_48;
  ON_UUID local_40;
  
  if (component_index != (int *)0x0) {
    *component_index = -0x7fffffff;
  }
  local_4c = -0x7fffffff;
  bVar4 = ReadInt(this,&local_4c);
  OVar3 = local_4c;
  if (!bVar4) {
    return bVar4;
  }
  lVar9 = (long)local_4c;
  iVar7 = OVar3;
  if ((lVar9 < 0) || (this->m_bReferencedComponentIndexMapping == false)) goto joined_r0x0053d072;
  if (component_type == TextStyle) {
    local_4c = -0x7fffffff;
    component_type = DimStyle;
    if ((OVar3 < (this->m_text_style_to_dim_style_archive_index_map).m_count) &&
       (pOVar1 = (this->m_text_style_to_dim_style_archive_index_map).m_a, iVar7 = pOVar1[lVar9].j,
       -1 < iVar7 && OVar3 == pOVar1[lVar9].i)) {
      local_4c = iVar7;
    }
  }
  if (component_type == DimStyle) {
    iVar6 = Archive3dmVersion(this);
    iVar7 = local_4c;
    if (iVar6 < 0x33) goto joined_r0x0053d072;
    if (((-1 < (long)local_4c) && (local_4c < (this->m_archive_dim_style_table).m_count)) &&
       (pOVar2 = (this->m_archive_dim_style_table).m_a[local_4c], pOVar2 != (ON_DimStyle *)0x0)) {
      bVar5 = ::operator==(&ON_nil_uuid,&(pOVar2->super_ON_ModelComponent).m_component_parent_id);
      iVar7 = local_4c;
      if (!bVar5) goto joined_r0x0053d072;
      local_48 = &(pOVar2->super_ON_ModelComponent).m_component_id;
      this_00 = ON_ComponentManifest::ItemFromId
                          (&this->m_manifest,DimStyle,
                           (pOVar2->super_ON_ModelComponent).m_component_id);
      local_40 = ON_ComponentManifestItem::Id(this_00);
      bVar5 = ::operator==(&local_40,local_48);
      if (bVar5) {
        local_4c = ON_ComponentManifestItem::Index(this_00);
      }
    }
  }
  local_48 = (ON_UUID_struct *)&this->m_manifest_map;
  this_01 = ON_ManifestMap::MapItemFromSourceIndex
                      ((ON_ManifestMap *)local_48,component_type,local_4c);
  bVar5 = ON_ManifestMapItem::SourceAndDestinationAreSet(this_01);
  if ((!bVar5) || (iVar7 = ON_ManifestMapItem::DestinationIndex(this_01), iVar7 == -0x7fffffff)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0xbf6,"","Unable to update component index.");
    if (1 < component_type - 7) {
      if (component_type == LinePattern) {
        pOVar8 = (ON_Material *)&ON_Linetype::Continuous;
      }
      else {
        iVar7 = OVar3;
        if (component_type != Material) goto joined_r0x0053d072;
        pOVar8 = &ON_Material::Default;
      }
      iVar7 = (pOVar8->super_ON_ModelComponent).m_component_index;
      goto joined_r0x0053d072;
    }
    iVar7 = OVar3;
    if (this->m_archive_current_dim_style == (ON_DimStyle *)0x0) goto joined_r0x0053d072;
    this_01 = ON_ManifestMap::MapItemFromSourceIndex
                        ((ON_ManifestMap *)local_48,DimStyle,
                         (this->m_archive_current_dim_style->super_ON_ModelComponent).
                         m_component_index);
    bVar5 = ON_ManifestMapItem::SourceAndDestinationAreSet(this_01);
    if ((!bVar5) || (iVar6 = ON_ManifestMapItem::DestinationIndex(this_01), iVar6 == -0x7fffffff))
    goto joined_r0x0053d072;
  }
  iVar7 = ON_ManifestMapItem::DestinationIndex(this_01);
joined_r0x0053d072:
  if (component_index != (int *)0x0) {
    *component_index = iVar7;
  }
  return bVar4;
}

Assistant:

bool ON_BinaryArchive::Read3dmReferencedComponentIndex(
  ON_ModelComponent::Type component_type,
  int* component_index
  )
{
  if (nullptr != component_index)
    *component_index = ON_UNSET_INT_INDEX;

  int archive_component_index = ON_UNSET_INT_INDEX;
  if (!ReadInt(&archive_component_index))
    return false;
  
  if (archive_component_index < 0 || false == ReferencedComponentIndexMapping() )
  {
    // system component with a persistent negative index
    if (nullptr != component_index)
      *component_index = archive_component_index;
    return true;
  }

  int updated_component_index = archive_component_index;

  if (ON_ModelComponent::Type::TextStyle == component_type)
  {
    component_type = ON_ModelComponent::Type::DimStyle;
    const int archive_text_style_index = archive_component_index;
    archive_component_index = ON_UNSET_INT_INDEX;
    if (archive_text_style_index >= 0
      && archive_text_style_index < m_text_style_to_dim_style_archive_index_map.Count()
      )
    {
      const ON_2dex ts_to_ds = m_text_style_to_dim_style_archive_index_map[archive_text_style_index];
      if (archive_text_style_index == ts_to_ds.i && ts_to_ds.j >= 0)
      {
        archive_component_index = ts_to_ds.j;
      }
    }
  }

  if (ON_ModelComponent::Type::DimStyle == component_type)
  {
    if (this->Archive3dmVersion() <= 50)
    {
      if (nullptr != component_index)
        *component_index = archive_component_index;

      return true;
    }
    const int archive_dim_style_index = archive_component_index;
    if (archive_dim_style_index >= 0
      && archive_dim_style_index < m_archive_dim_style_table.Count()
      )
    {
      const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[archive_dim_style_index];
      if (nullptr != archive_dim_style)
      {
        if (archive_dim_style->ParentIdIsNotNil())
        {
          // override dimstyle - not in manifests or dimstyle table.
          if (nullptr != component_index)
            *component_index = archive_component_index;

          return true;
        }

        const ON_ComponentManifestItem& item = m_manifest.ItemFromId(ON_ModelComponent::Type::DimStyle,archive_dim_style->Id());
        if ( item.Id() == archive_dim_style->Id() )
        {
          archive_component_index = item.Index();
        }
      }
    }
  }

  const ON_ManifestMapItem& map_item = m_manifest_map.MapItemFromSourceIndex(component_type,archive_component_index);
  if (map_item.SourceAndDestinationAreSet() && ON_UNSET_INT_INDEX != map_item.DestinationIndex())
  {
    updated_component_index = map_item.DestinationIndex();
  }
  else
  {
    ON_ERROR("Unable to update component index.");

    // Get something that might work when possible
    switch (component_type)
    {
    case ON_ModelComponent::Type::Image:
      break;
    case ON_ModelComponent::Type::TextureMapping:
      break;
    case ON_ModelComponent::Type::Material:
      updated_component_index = ON_Material::Default.Index();
      break;
    case ON_ModelComponent::Type::LinePattern:
      updated_component_index = ON_Linetype::Continuous.Index();
      break;
    case ON_ModelComponent::Type::Layer:
      break;
    case ON_ModelComponent::Type::Group:
      break;

    case ON_ModelComponent::Type::TextStyle:
    case ON_ModelComponent::Type::DimStyle:
      if (nullptr != m_archive_current_dim_style)
      {
        const ON_ManifestMapItem& archive_current_dim_style_map_item = m_manifest_map.MapItemFromSourceIndex(ON_ModelComponent::Type::DimStyle,m_archive_current_dim_style->Index());
        if (archive_current_dim_style_map_item.SourceAndDestinationAreSet()
          && ON_UNSET_INT_INDEX != archive_current_dim_style_map_item.DestinationIndex()
          )
        {
          updated_component_index = archive_current_dim_style_map_item.DestinationIndex();
        }
      }
      break;

    case ON_ModelComponent::Type::RenderLight:
      break;
    case ON_ModelComponent::Type::HatchPattern:
      break;
    case ON_ModelComponent::Type::InstanceDefinition:
      break;
    case ON_ModelComponent::Type::ModelGeometry:
      break;
    case ON_ModelComponent::Type::HistoryRecord:
      break;
    default:
      break;
    }
  }

  if (nullptr != component_index)
    *component_index = updated_component_index;

  return true; // true indicates the read worked, even if the component index cannot be updated.
}